

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O1

bool __thiscall cppcms::xss::uri_parser::hier_part(uri_parser *this)

{
  bool bVar1;
  bool bVar2;
  byte unaff_R14B;
  char *pcVar3;
  
  pcVar3 = this->begin_;
  bVar1 = follows(this,"//");
  if (bVar1) {
    bVar2 = authority(this);
    if (bVar2) {
      unaff_R14B = path_abempty(this);
      if ((bool)unaff_R14B) {
        pcVar3 = this->begin_;
      }
    }
    else {
      unaff_R14B = 0;
    }
  }
  this->begin_ = pcVar3;
  if (!bVar1) {
    bVar1 = path_absolute(this);
    unaff_R14B = 1;
    if (!bVar1) {
      path_rootless(this);
    }
  }
  return (bool)(unaff_R14B & 1);
}

Assistant:

bool hier_part()
		{
			{
				save_point sp(this);
				if(follows("//")) {
					if(!authority() || !path_abempty()) 
						return false;
					sp.commit();
					return true;
				}
			}

			return path_absolute() || path_rootless() || true;
		}